

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O0

QString * __thiscall
QCommandLineParserPrivate::helpText(QCommandLineParserPrivate *this,bool includeQtOptions)

{
  QStringView v;
  bool bVar1;
  undefined1 uVar2;
  QCoreApplication *pQVar3;
  QCoreApplicationPrivate *pQVar4;
  QString *this_00;
  qsizetype qVar5;
  PositionalArgumentDefinition *this_01;
  longlong *plVar6;
  const_iterator o;
  byte in_DL;
  QString *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<char16_t,_const_QString_&> QVar7;
  PositionalArgumentDefinition *arg_2;
  QList<QCommandLineParserPrivate::PositionalArgumentDefinition> *__range2_1;
  QCommandLineOption *option_1;
  add_const_t<QList<QCommandLineOption>_> *__range1_3;
  int optionNameMaxWidth;
  PositionalArgumentDefinition *arg_1;
  QList<QCommandLineParserPrivate::PositionalArgumentDefinition> *__range1_2;
  int numDashes;
  QString *optionName;
  QStringList *__range2;
  QCommandLineOption *option;
  add_const_t<QList<QCommandLineOption>_> *__range1_1;
  PositionalArgumentDefinition *arg;
  QList<QCommandLineParserPrivate::PositionalArgumentDefinition> *__range1;
  QString *text;
  size_t RuntimeThreshold;
  size_t i;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  const_iterator __end1_3;
  const_iterator __begin1_3;
  const_iterator optionNameIterator;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  QString valueName;
  const_iterator __end2;
  const_iterator __begin2;
  QString optionNamesString;
  QStringList optionNames;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  qsizetype longestOptionNameString;
  QStringList optionNameList;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QCommandLineOption> options;
  QString usage;
  QLatin1Char nl;
  undefined4 in_stack_fffffffffffffa68;
  Flag in_stack_fffffffffffffa6c;
  QStringBuilder<QLatin1String,_const_QString_&> *in_stack_fffffffffffffa70;
  QString *in_stack_fffffffffffffa78;
  undefined4 in_stack_fffffffffffffa80;
  int in_stack_fffffffffffffa84;
  QString *in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffa94;
  QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String>
  *in_stack_fffffffffffffa98;
  undefined7 in_stack_fffffffffffffaa0;
  undefined1 in_stack_fffffffffffffaa7;
  QList<QString> *in_stack_fffffffffffffab8;
  QString *description;
  QString *in_stack_fffffffffffffb00;
  ulong local_3e8;
  int in_stack_fffffffffffffc44;
  const_iterator local_3a8 [8];
  char local_363;
  QFlagsStorageHelper<QCommandLineOption::Flag,_4> local_330;
  QFlagsStorageHelper<QCommandLineOption::Flag,_4> local_32c;
  QCommandLineOption *local_328;
  const_iterator local_320;
  const_iterator local_318;
  const_iterator local_310;
  int local_308 [2];
  qsizetype local_300;
  PositionalArgumentDefinition *local_2f8;
  const_iterator local_2f0;
  const_iterator local_2e8;
  qsizetype local_2e0;
  undefined2 local_2d2;
  QLatin1StringView local_2d0;
  undefined1 *local_2a8;
  undefined1 *puStack_2a0;
  undefined1 *local_298;
  QLatin1StringView local_288;
  QLatin1String local_278 [5];
  QString *local_228;
  const_iterator local_220;
  const_iterator local_218;
  QString local_210;
  undefined1 *local_1f8;
  undefined1 *puStack_1f0;
  undefined1 *local_1e8;
  QFlagsStorageHelper<QCommandLineOption::Flag,_4> local_1e0;
  QFlagsStorageHelper<QCommandLineOption::Flag,_4> local_1dc;
  QCommandLineOption *local_1d8;
  const_iterator local_1d0;
  const_iterator local_1c8;
  longlong local_1c0;
  QString local_1b8 [3];
  char local_163;
  QStringBuilder<const_QString_&,_const_QLatin1Char_&> local_160;
  QChar local_14a [44];
  undefined2 local_f2;
  char16_t local_f0;
  QString *local_e8;
  PositionalArgumentDefinition *local_e0;
  const_iterator local_d8;
  const_iterator local_d0 [4];
  undefined2 local_aa;
  QList<QCommandLineOption> local_88 [2];
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  QLatin1Char local_29 [33];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_29[0].ch = -0x56;
  QLatin1Char::QLatin1Char(local_29,'\n');
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x6f308e);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x6f30c8);
  pQVar3 = QCoreApplication::instance();
  bVar1 = false;
  if (pQVar3 == (QCoreApplication *)0x0) {
    std::data<char16_t_const,18ul>((char16_t (*) [18])L"<executable_name>");
    for (local_3e8 = 0; (local_3e8 < 0x12 && (L"<executable_name>"[local_3e8] != L'\0'));
        local_3e8 = local_3e8 + 1) {
    }
    QStringView::QStringView<char16_t,_true>
              ((QStringView *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
               (char16_t *)in_stack_fffffffffffffa78,(qsizetype)in_stack_fffffffffffffa70);
  }
  else {
    QCoreApplication::arguments();
    bVar1 = true;
    QList<QString>::constFirst((QList<QString> *)in_stack_fffffffffffffa70);
    QStringView::QStringView<QString,_true>
              ((QStringView *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
               in_stack_fffffffffffffa78);
  }
  v.m_size._4_4_ = in_stack_fffffffffffffa84;
  v.m_size._0_4_ = in_stack_fffffffffffffa80;
  v.m_data = (storage_type_conflict *)in_stack_fffffffffffffa88;
  QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68),v);
  if (bVar1) {
    QList<QString>::~QList((QList<QString> *)0x6f325d);
  }
  local_88[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88[0].d.ptr = (QCommandLineOption *)&DAT_aaaaaaaaaaaaaaaa;
  local_88[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QCommandLineOption>::QList
            ((QList<QCommandLineOption> *)in_stack_fffffffffffffa70,
             (QList<QCommandLineOption> *)
             CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
  if (((in_DL & 1) != 0) &&
     (pQVar3 = QCoreApplication::instance(), pQVar3 != (QCoreApplication *)0x0)) {
    QCoreApplication::instance();
    pQVar4 = QCoreApplication::d_func((QCoreApplication *)0x6f32cd);
    (*(pQVar4->super_QObjectPrivate).super_QObjectData._vptr_QObjectData[4])(pQVar4,local_88);
  }
  bVar1 = QList<QCommandLineOption>::isEmpty((QList<QCommandLineOption> *)0x6f3362);
  if (!bVar1) {
    local_aa = 0x20;
    QCommandLineParser::tr
              ((char *)in_stack_fffffffffffffa78,(char *)in_stack_fffffffffffffa70,
               in_stack_fffffffffffffa6c);
    ::operator+((char16_t *)in_stack_fffffffffffffa78,(QString *)in_stack_fffffffffffffa70);
    ::operator+=((QString *)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
                 (QStringBuilder<char16_t,_QString> *)in_stack_fffffffffffffa98);
    QStringBuilder<char16_t,_QString>::~QStringBuilder
              ((QStringBuilder<char16_t,_QString> *)0x6f33d6);
    QString::~QString((QString *)0x6f33e3);
  }
  local_d0[0].i = (PositionalArgumentDefinition *)&DAT_aaaaaaaaaaaaaaaa;
  local_d0[0] = QList<QCommandLineParserPrivate::PositionalArgumentDefinition>::begin
                          ((QList<QCommandLineParserPrivate::PositionalArgumentDefinition> *)
                           in_stack_fffffffffffffa70);
  local_d8.i = (PositionalArgumentDefinition *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8 = QList<QCommandLineParserPrivate::PositionalArgumentDefinition>::end
                       ((QList<QCommandLineParserPrivate::PositionalArgumentDefinition> *)
                        in_stack_fffffffffffffa70);
  while( true ) {
    local_e0 = local_d8.i;
    bVar1 = QList<QCommandLineParserPrivate::PositionalArgumentDefinition>::const_iterator::
            operator!=(local_d0,local_d8);
    if (!bVar1) break;
    QList<QCommandLineParserPrivate::PositionalArgumentDefinition>::const_iterator::operator*
              (local_d0);
    local_f2 = 0x20;
    QVar7 = ::operator+((char16_t *)in_stack_fffffffffffffa70,
                        (QString *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
    local_e8 = QVar7.b;
    local_f0 = QVar7.a;
    ::operator+=((QString *)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
                 (QStringBuilder<char16_t,_const_QString_&> *)in_stack_fffffffffffffa98);
    QList<QCommandLineParserPrivate::PositionalArgumentDefinition>::const_iterator::operator++
              (local_d0);
  }
  QCommandLineParser::tr
            ((char *)in_stack_fffffffffffffa78,(char *)in_stack_fffffffffffffa70,
             in_stack_fffffffffffffa6c);
  QChar::QChar<char16_t,_true>(local_14a,L' ');
  QString::arg<QString,_true>
            ((QString *)CONCAT44(in_stack_fffffffffffffa94,in_stack_fffffffffffffa90),
             in_stack_fffffffffffffa88,in_stack_fffffffffffffa84,
             (QChar)(char16_t)((ulong)in_stack_fffffffffffffab8 >> 0x30));
  ::operator+(in_stack_fffffffffffffa78,(QLatin1Char *)in_stack_fffffffffffffa70);
  ::operator+=((QString *)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
               (QStringBuilder<QString,_const_QLatin1Char_&> *)in_stack_fffffffffffffa98);
  QStringBuilder<QString,_const_QLatin1Char_&>::~QStringBuilder
            ((QStringBuilder<QString,_const_QLatin1Char_&> *)0x6f363d);
  QString::~QString((QString *)0x6f364a);
  QString::~QString((QString *)0x6f3657);
  bVar1 = QString::isEmpty((QString *)0x6f366b);
  if (!bVar1) {
    local_160 = ::operator+((QString *)in_stack_fffffffffffffa70,
                            (QLatin1Char *)
                            CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
    in_stack_fffffffffffffb00 = (QString *)local_160.b;
    ::operator+=((QString *)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
                 (QStringBuilder<const_QString_&,_const_QLatin1Char_&> *)in_stack_fffffffffffffa98);
  }
  local_163 = local_29[0].ch;
  QChar::QChar<QLatin1Char,_true>
            ((QChar *)in_stack_fffffffffffffa70,
             (QLatin1Char)(char)((ulong)in_stack_fffffffffffffa78 >> 0x38));
  QString::operator+=((QString *)in_stack_fffffffffffffa70,
                      (QChar)(char16_t)((ulong)in_stack_fffffffffffffa78 >> 0x30));
  bVar1 = QList<QCommandLineOption>::isEmpty((QList<QCommandLineOption> *)0x6f3799);
  if (!bVar1) {
    QCommandLineParser::tr
              ((char *)in_stack_fffffffffffffa78,(char *)in_stack_fffffffffffffa70,
               in_stack_fffffffffffffa6c);
    ::operator+(in_stack_fffffffffffffa78,(QLatin1Char *)in_stack_fffffffffffffa70);
    ::operator+=((QString *)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
                 (QStringBuilder<QString,_const_QLatin1Char_&> *)in_stack_fffffffffffffa98);
    QStringBuilder<QString,_const_QLatin1Char_&>::~QStringBuilder
              ((QStringBuilder<QString,_const_QLatin1Char_&> *)0x6f3803);
    QString::~QString((QString *)0x6f3810);
  }
  local_1b8[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_1b8[0].d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_1b8[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  description = local_1b8;
  QList<QString>::QList((QList<QString> *)0x6f3899);
  QList<QCommandLineOption>::size(local_88);
  QList<QString>::reserve(in_stack_fffffffffffffab8,(qsizetype)description);
  local_1c0 = 0;
  local_1c8.i = (QCommandLineOption *)&DAT_aaaaaaaaaaaaaaaa;
  local_1c8 = QList<QCommandLineOption>::begin
                        ((QList<QCommandLineOption> *)in_stack_fffffffffffffa70);
  local_1d0.i = (QCommandLineOption *)&DAT_aaaaaaaaaaaaaaaa;
  local_1d0 = QList<QCommandLineOption>::end((QList<QCommandLineOption> *)in_stack_fffffffffffffa70)
  ;
  while( true ) {
    local_1d8 = local_1d0.i;
    bVar1 = QList<QCommandLineOption>::const_iterator::operator!=(&local_1c8,local_1d0);
    if (!bVar1) break;
    QList<QCommandLineOption>::const_iterator::operator*(&local_1c8);
    local_1e0.super_QFlagsStorage<QCommandLineOption::Flag>.i =
         (QFlagsStorage<QCommandLineOption::Flag>)
         QCommandLineOption::flags((QCommandLineOption *)in_stack_fffffffffffffa70);
    local_1dc.super_QFlagsStorage<QCommandLineOption::Flag>.i =
         (QFlagsStorage<QCommandLineOption::Flag>)
         QFlags<QCommandLineOption::Flag>::operator&
                   ((QFlags<QCommandLineOption::Flag> *)in_stack_fffffffffffffa70,
                    in_stack_fffffffffffffa6c);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_1dc);
    if (!bVar1) {
      local_1f8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_1f0 = &DAT_aaaaaaaaaaaaaaaa;
      local_1e8 = &DAT_aaaaaaaaaaaaaaaa;
      QCommandLineOption::names((QCommandLineOption *)in_stack_fffffffffffffa78);
      local_210.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_210.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_210.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QString::QString((QString *)0x6f3a83);
      local_218.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      local_218 = QList<QString>::begin((QList<QString> *)in_stack_fffffffffffffa70);
      local_220.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      local_220 = QList<QString>::end((QList<QString> *)in_stack_fffffffffffffa70);
      while( true ) {
        local_228 = local_220.i;
        bVar1 = QList<QString>::const_iterator::operator!=(&local_218,local_220);
        if (!bVar1) break;
        this_00 = QList<QString>::const_iterator::operator*(&local_218);
        qVar5 = QString::size(this_00);
        QLatin1String::QLatin1String(local_278,"--",(long)(int)((qVar5 != 1) + 1));
        ::operator+(&in_stack_fffffffffffffa70->a,
                    (QString *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
        local_288 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)in_stack_fffffffffffffa78,(size_t)in_stack_fffffffffffffa70);
        ::operator+(in_stack_fffffffffffffa70,
                    (QLatin1String *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
        ::operator+=((QString *)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
                     in_stack_fffffffffffffa98);
        QList<QString>::const_iterator::operator++(&local_218);
      }
      bVar1 = QList<QString>::isEmpty((QList<QString> *)0x6f3c4c);
      if (!bVar1) {
        QString::chop((QString *)in_stack_fffffffffffffa70,
                      CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
      }
      local_2a8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_2a0 = &DAT_aaaaaaaaaaaaaaaa;
      local_298 = &DAT_aaaaaaaaaaaaaaaa;
      QCommandLineOption::valueName((QCommandLineOption *)in_stack_fffffffffffffa78);
      bVar1 = QString::isEmpty((QString *)0x6f3cab);
      if (!bVar1) {
        local_2d0 = Qt::Literals::StringLiterals::operator____L1
                              ((char *)in_stack_fffffffffffffa78,(size_t)in_stack_fffffffffffffa70);
        ::operator+(&in_stack_fffffffffffffa70->a,
                    (QString *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
        local_2d2 = 0x3e;
        ::operator+(in_stack_fffffffffffffa70,
                    (char16_t *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
        ::operator+=((QString *)CONCAT17(in_stack_fffffffffffffaa7,in_stack_fffffffffffffaa0),
                     (QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_char16_t> *)
                     in_stack_fffffffffffffa98);
      }
      QList<QString>::append
                ((QList<QString> *)in_stack_fffffffffffffa70,
                 (parameter_type)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
      local_2e0 = QString::size(&local_210);
      plVar6 = qMax<long_long>(&local_1c0,&local_2e0);
      local_1c0 = *plVar6;
      QString::~QString((QString *)0x6f3dc4);
      QString::~QString((QString *)0x6f3dd1);
      QList<QString>::~QList((QList<QString> *)0x6f3dde);
    }
    QList<QCommandLineOption>::const_iterator::operator++(&local_1c8);
  }
  local_2e8.i = (PositionalArgumentDefinition *)&DAT_aaaaaaaaaaaaaaaa;
  local_2e8 = QList<QCommandLineParserPrivate::PositionalArgumentDefinition>::begin
                        ((QList<QCommandLineParserPrivate::PositionalArgumentDefinition> *)
                         in_stack_fffffffffffffa70);
  local_2f0.i = (PositionalArgumentDefinition *)&DAT_aaaaaaaaaaaaaaaa;
  local_2f0 = QList<QCommandLineParserPrivate::PositionalArgumentDefinition>::end
                        ((QList<QCommandLineParserPrivate::PositionalArgumentDefinition> *)
                         in_stack_fffffffffffffa70);
  while( true ) {
    local_2f8 = local_2f0.i;
    bVar1 = QList<QCommandLineParserPrivate::PositionalArgumentDefinition>::const_iterator::
            operator!=(&local_2e8,local_2f0);
    if (!bVar1) break;
    this_01 = QList<QCommandLineParserPrivate::PositionalArgumentDefinition>::const_iterator::
              operator*(&local_2e8);
    local_300 = QString::size(&this_01->name);
    plVar6 = qMax<long_long>(&local_1c0,&local_300);
    local_1c0 = *plVar6;
    QList<QCommandLineParserPrivate::PositionalArgumentDefinition>::const_iterator::operator++
              (&local_2e8);
  }
  local_1c0 = local_1c0 + 1;
  local_308[1] = 0x32;
  local_308[0] = (int)local_1c0;
  qMin<int>(local_308 + 1,local_308);
  local_310.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_310 = QList<QString>::cbegin((QList<QString> *)in_stack_fffffffffffffa70);
  local_318.i = (QCommandLineOption *)&DAT_aaaaaaaaaaaaaaaa;
  local_318 = QList<QCommandLineOption>::begin
                        ((QList<QCommandLineOption> *)in_stack_fffffffffffffa70);
  local_320.i = (QCommandLineOption *)&DAT_aaaaaaaaaaaaaaaa;
  local_320 = QList<QCommandLineOption>::end((QList<QCommandLineOption> *)in_stack_fffffffffffffa70)
  ;
  while( true ) {
    local_328 = local_320.i;
    uVar2 = QList<QCommandLineOption>::const_iterator::operator!=(&local_318,local_320);
    if (!(bool)uVar2) break;
    in_stack_fffffffffffffa98 =
         (QStringBuilder<QStringBuilder<QLatin1String,_const_QString_&>,_QLatin1String> *)
         QList<QCommandLineOption>::const_iterator::operator*(&local_318);
    local_330.super_QFlagsStorage<QCommandLineOption::Flag>.i =
         (QFlagsStorage<QCommandLineOption::Flag>)
         QCommandLineOption::flags((QCommandLineOption *)in_stack_fffffffffffffa70);
    local_32c.super_QFlagsStorage<QCommandLineOption::Flag>.i =
         (QFlagsStorage<QCommandLineOption::Flag>)
         QFlags<QCommandLineOption::Flag>::operator&
                   ((QFlags<QCommandLineOption::Flag> *)in_stack_fffffffffffffa70,
                    in_stack_fffffffffffffa6c);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_32c);
    if (!bVar1) {
      QList<QString>::const_iterator::operator*(&local_310);
      QCommandLineOption::description((QCommandLineOption *)in_stack_fffffffffffffa78);
      wrapText(in_stack_fffffffffffffb00,in_stack_fffffffffffffc44,description);
      QString::operator+=((QString *)in_stack_fffffffffffffa70,
                          (QString *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
      QString::~QString((QString *)0x6f4159);
      QString::~QString((QString *)0x6f4166);
      QList<QString>::const_iterator::operator++(&local_310);
    }
    QList<QCommandLineOption>::const_iterator::operator++(&local_318);
  }
  bVar1 = QList<QCommandLineParserPrivate::PositionalArgumentDefinition>::isEmpty
                    ((QList<QCommandLineParserPrivate::PositionalArgumentDefinition> *)0x6f41f0);
  if (!bVar1) {
    bVar1 = QList<QCommandLineOption>::isEmpty((QList<QCommandLineOption> *)0x6f4205);
    if (!bVar1) {
      local_363 = local_29[0].ch;
      QChar::QChar<QLatin1Char,_true>
                ((QChar *)in_stack_fffffffffffffa70,
                 (QLatin1Char)(char)((ulong)in_stack_fffffffffffffa78 >> 0x38));
      QString::operator+=((QString *)in_stack_fffffffffffffa70,
                          (QChar)(char16_t)((ulong)in_stack_fffffffffffffa78 >> 0x30));
    }
    QCommandLineParser::tr
              ((char *)in_stack_fffffffffffffa78,(char *)in_stack_fffffffffffffa70,
               in_stack_fffffffffffffa6c);
    ::operator+(in_stack_fffffffffffffa78,(QLatin1Char *)in_stack_fffffffffffffa70);
    ::operator+=((QString *)CONCAT17(uVar2,in_stack_fffffffffffffaa0),
                 (QStringBuilder<QString,_const_QLatin1Char_&> *)in_stack_fffffffffffffa98);
    QStringBuilder<QString,_const_QLatin1Char_&>::~QStringBuilder
              ((QStringBuilder<QString,_const_QLatin1Char_&> *)0x6f42a7);
    QString::~QString((QString *)0x6f42b4);
    local_3a8[0].i = (PositionalArgumentDefinition *)&DAT_aaaaaaaaaaaaaaaa;
    local_3a8[0] = QList<QCommandLineParserPrivate::PositionalArgumentDefinition>::begin
                             ((QList<QCommandLineParserPrivate::PositionalArgumentDefinition> *)
                              in_stack_fffffffffffffa70);
    o = QList<QCommandLineParserPrivate::PositionalArgumentDefinition>::end
                  ((QList<QCommandLineParserPrivate::PositionalArgumentDefinition> *)
                   in_stack_fffffffffffffa70);
    while( true ) {
      bVar1 = QList<QCommandLineParserPrivate::PositionalArgumentDefinition>::const_iterator::
              operator!=(local_3a8,o);
      if (!bVar1) break;
      QList<QCommandLineParserPrivate::PositionalArgumentDefinition>::const_iterator::operator*
                (local_3a8);
      wrapText(in_stack_fffffffffffffb00,in_stack_fffffffffffffc44,description);
      QString::operator+=((QString *)in_stack_fffffffffffffa70,
                          (QString *)CONCAT44(in_stack_fffffffffffffa6c,in_stack_fffffffffffffa68));
      QString::~QString((QString *)0x6f43d8);
      QList<QCommandLineParserPrivate::PositionalArgumentDefinition>::const_iterator::operator++
                (local_3a8);
    }
  }
  QList<QString>::~QList((QList<QString> *)0x6f4478);
  QList<QCommandLineOption>::~QList((QList<QCommandLineOption> *)0x6f4485);
  QString::~QString((QString *)0x6f4492);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QCommandLineParserPrivate::helpText(bool includeQtOptions) const
{
    const QLatin1Char nl('\n');
    QString text;
    QString usage;
    // executable name
    usage += qApp ? QStringView(QCoreApplication::arguments().constFirst())
                  : QStringView(u"<executable_name>");
    QList<QCommandLineOption> options = commandLineOptionList;
    if (includeQtOptions && qApp)
        qApp->d_func()->addQtOptions(&options);
    if (!options.isEmpty())
        usage += u' ' + QCommandLineParser::tr("[options]");
    for (const PositionalArgumentDefinition &arg : positionalArgumentDefinitions)
        usage += u' ' + arg.syntax;
    text += QCommandLineParser::tr("Usage: %1").arg(usage) + nl;
    if (!description.isEmpty())
        text += description + nl;
    text += nl;
    if (!options.isEmpty())
        text += QCommandLineParser::tr("Options:") + nl;

    QStringList optionNameList;
    optionNameList.reserve(options.size());
    qsizetype longestOptionNameString = 0;
    for (const QCommandLineOption &option : std::as_const(options)) {
        if (option.flags() & QCommandLineOption::HiddenFromHelp)
            continue;
        const QStringList optionNames = option.names();
        QString optionNamesString;
        for (const QString &optionName : optionNames) {
            const int numDashes = optionName.size() == 1 ? 1 : 2;
            optionNamesString += QLatin1StringView("--", numDashes) + optionName + ", "_L1;
        }
        if (!optionNames.isEmpty())
            optionNamesString.chop(2); // remove trailing ", "
        const auto valueName = option.valueName();
        if (!valueName.isEmpty())
            optionNamesString += " <"_L1 + valueName + u'>';
        optionNameList.append(optionNamesString);
        longestOptionNameString = qMax(longestOptionNameString, optionNamesString.size());
    }

    for (const PositionalArgumentDefinition &arg : positionalArgumentDefinitions)
        longestOptionNameString = qMax(longestOptionNameString, arg.name.size());

    ++longestOptionNameString;
    const int optionNameMaxWidth = qMin(50, int(longestOptionNameString));
    auto optionNameIterator = optionNameList.cbegin();
    for (const QCommandLineOption &option : std::as_const(options)) {
        if (option.flags() & QCommandLineOption::HiddenFromHelp)
            continue;
        text += wrapText(*optionNameIterator, optionNameMaxWidth, option.description());
        ++optionNameIterator;
    }
    if (!positionalArgumentDefinitions.isEmpty()) {
        if (!options.isEmpty())
            text += nl;
        text += QCommandLineParser::tr("Arguments:") + nl;
        for (const PositionalArgumentDefinition &arg : positionalArgumentDefinitions)
            text += wrapText(arg.name, optionNameMaxWidth, arg.description);
    }
    return text;
}